

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O1

void __thiscall QMarkdownTextEdit::duplicateText(QMarkdownTextEdit *this)

{
  MoveMode MVar1;
  MoveMode MVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QByteArrayView QVar6;
  QTextCursor cursor;
  QString selectedText;
  undefined1 local_70 [24];
  long local_58;
  QArrayData *local_50;
  QString local_38;
  
  QPlainTextEdit::textCursor();
  QTextCursor::selectedText();
  if (local_58 == 0) {
    iVar3 = QTextCursor::position();
    QTextCursor::movePosition((MoveOperation)local_70,4,0);
    QTextCursor::movePosition((MoveOperation)local_70,0xf,1);
    iVar4 = QTextCursor::position();
    QTextCursor::selectedText();
    QVar6.m_data = (storage_type *)0x1;
    QVar6.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar6);
    QString::append(&local_38);
    QString::operator=((QString *)(local_70 + 8),&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,8);
      }
    }
    MVar1 = QTextCursor::selectionEnd();
    QTextCursor::setPosition((int)local_70,MVar1);
    QTextCursor::insertText((QString *)local_70);
    iVar5 = QTextCursor::position();
    QTextCursor::setPosition((int)local_70,(iVar3 - iVar4) + iVar5);
  }
  else {
    MVar1 = QTextCursor::selectionEnd();
    QTextCursor::setPosition((int)local_70,MVar1);
    MVar1 = QTextCursor::position();
    QTextCursor::insertText((QString *)local_70);
    MVar2 = QTextCursor::position();
    QTextCursor::setPosition((int)local_70,MVar1);
    QTextCursor::setPosition((int)local_70,MVar2);
  }
  QPlainTextEdit::setTextCursor((QTextCursor *)this);
  if ((QArrayData *)local_70._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_70._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_70._8_8_,2,8);
    }
  }
  QTextCursor::~QTextCursor((QTextCursor *)local_70);
  return;
}

Assistant:

void QMarkdownTextEdit::duplicateText() {
    QTextCursor cursor = this->textCursor();
    QString selectedText = cursor.selectedText();

    // duplicate line if no text was selected
    if (selectedText.isEmpty()) {
        const int position = cursor.position();

        // select the whole line
        cursor.movePosition(QTextCursor::StartOfBlock);
        cursor.movePosition(QTextCursor::EndOfBlock, QTextCursor::KeepAnchor);

        const int positionDiff = cursor.position() - position;
        selectedText = "\n" + cursor.selectedText();

        // insert text with new line at end of the selected line
        cursor.setPosition(cursor.selectionEnd());
        cursor.insertText(selectedText);

        // set the position to same position it was in the duplicated line
        cursor.setPosition(cursor.position() - positionDiff);
    } else {
        // duplicate selected text
        cursor.setPosition(cursor.selectionEnd());
        const int selectionStart = cursor.position();

        // insert selected text
        cursor.insertText(selectedText);
        const int selectionEnd = cursor.position();

        // select the inserted text
        cursor.setPosition(selectionStart);
        cursor.setPosition(selectionEnd, QTextCursor::KeepAnchor);
    }

    this->setTextCursor(cursor);
}